

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O3

void __thiscall draco::EntryValue::EntryValue<int>(EntryValue *this,int *data)

{
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,4);
  *(int *)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = *data;
  return;
}

Assistant:

explicit EntryValue(const DataTypeT &data) {
    const size_t data_type_size = sizeof(DataTypeT);
    data_.resize(data_type_size);
    memcpy(&data_[0], &data, data_type_size);
  }